

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O2

void __thiscall
vkt::image::anon_unknown_0::StoreTestInstance::StoreTestInstance
          (StoreTestInstance *this,Context *context,Texture *texture,VkFormat format,
          bool declareImageFormatInShader,bool singleLayerBind)

{
  undefined1 auVar1 [16];
  VkDeviceSize VVar2;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *allocator;
  Buffer *this_00;
  ulong in_stack_ffffffffffffff90;
  VkBufferCreateInfo local_68;
  
  BaseTestInstance::BaseTestInstance
            (&this->super_BaseTestInstance,context,texture,format,declareImageFormatInShader,
             singleLayerBind);
  (this->super_BaseTestInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__StoreTestInstance_00bd9250;
  (this->m_imageBuffer).
  super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.ptr =
       (Buffer *)0x0;
  Texture::size((Texture *)&local_68);
  VVar2 = getImageSizeBytes((IVec3 *)&local_68,format);
  this->m_imageSizeBytes = VVar2;
  vk = Context::getDeviceInterface((this->super_BaseTestInstance).super_TestInstance.m_context);
  device = Context::getDevice((this->super_BaseTestInstance).super_TestInstance.m_context);
  allocator = Context::getDefaultAllocator
                        ((this->super_BaseTestInstance).super_TestInstance.m_context);
  this_00 = (Buffer *)operator_new(0x30);
  makeBufferCreateInfo(&local_68,this->m_imageSizeBytes,10);
  image::Buffer::Buffer(this_00,vk,device,allocator,&local_68,(MemoryRequirement)0x1);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_stack_ffffffffffffff90;
  de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::assignData
            (&(this->m_imageBuffer).
              super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>,
             (PtrData<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>)(auVar1 << 0x40))
  ;
  de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::~UniqueBase
            ((UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *)
             &stack0xffffffffffffff88);
  return;
}

Assistant:

StoreTestInstance::StoreTestInstance (Context& context, const Texture& texture, const VkFormat format, const bool declareImageFormatInShader, const bool singleLayerBind)
	: BaseTestInstance		(context, texture, format, declareImageFormatInShader, singleLayerBind)
	, m_imageSizeBytes		(getImageSizeBytes(texture.size(), format))
{
	const DeviceInterface&	vk			= m_context.getDeviceInterface();
	const VkDevice			device		= m_context.getDevice();
	Allocator&				allocator	= m_context.getDefaultAllocator();

	// A helper buffer with enough space to hold the whole image. Usage flags accommodate all derived test instances.

	m_imageBuffer = de::MovePtr<Buffer>(new Buffer(
		vk, device, allocator,
		makeBufferCreateInfo(m_imageSizeBytes, VK_BUFFER_USAGE_STORAGE_TEXEL_BUFFER_BIT | VK_BUFFER_USAGE_TRANSFER_DST_BIT),
		MemoryRequirement::HostVisible));
}